

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

bool __thiscall
cmCMakePresetsGraphInternal::AnyAllOfCondition::Evaluate
          (AnyAllOfCondition *this,MacroExpanderVector *expanders,int version,optional<bool> *out)

{
  pointer puVar1;
  Condition *pCVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  *condition;
  pointer puVar6;
  byte unaff_R13B;
  optional<bool> result;
  _Storage<bool,_true> local_3e;
  bool bStack_3d;
  uint local_3c;
  AnyAllOfCondition *local_38;
  
  puVar1 = (this->Conditions).
           super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  local_3c = version;
  for (puVar6 = (this->Conditions).
                super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; bVar4 = puVar6 == puVar1, !bVar4;
      puVar6 = puVar6 + 1) {
    _local_3e = (_Optional_payload_base<bool>)((ushort)_local_3e & 0xff);
    pCVar2 = (puVar6->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    iVar5 = (*pCVar2->_vptr_Condition[2])(pCVar2,expanders,(ulong)local_3c,&local_3e);
    if ((char)iVar5 == '\0') {
      if ((out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool>._M_engaged == true) {
        (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged = false;
      }
      bVar3 = false;
      unaff_R13B = 0;
    }
    else {
      if (bStack_3d == false) {
        if ((out->super__Optional_base<bool,_true,_true>)._M_payload.
            super__Optional_payload_base<bool>._M_engaged == true) {
          (out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool>._M_engaged = false;
        }
      }
      else {
        bVar3 = true;
        if (local_3e._M_value != local_38->StopValue) goto LAB_002678d7;
        (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>
             = _local_3e;
      }
      unaff_R13B = 1;
      bVar3 = false;
    }
LAB_002678d7:
    if (!bVar3) break;
  }
  if (bVar4) {
    (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool> =
         (_Optional_payload_base<bool>)(local_38->StopValue ^ 1 | 0x100);
    unaff_R13B = 1;
  }
  return (bool)(unaff_R13B & 1);
}

Assistant:

bool cmCMakePresetsGraphInternal::AnyAllOfCondition::Evaluate(
  MacroExpanderVector const& expanders, int version,
  cm::optional<bool>& out) const
{
  for (auto const& condition : this->Conditions) {
    cm::optional<bool> result;
    if (!condition->Evaluate(expanders, version, result)) {
      out.reset();
      return false;
    }

    if (!result) {
      out.reset();
      return true;
    }

    if (result == this->StopValue) {
      out = result;
      return true;
    }
  }

  out = !this->StopValue;
  return true;
}